

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.cpp
# Opt level: O2

void __thiscall Callback::Emitter::SignalActivation::~SignalActivation(SignalActivation *this)

{
  State SVar1;
  SignalData *pSVar2;
  SignalActivation *pSVar3;
  Item *pIVar4;
  int iVar5;
  undefined4 extraout_var;
  Item *local_20;
  
  if (this->invalidated == false) {
    pSVar2 = this->data;
    if (((pSVar2 != (SignalData *)0x0) &&
        (pSVar3 = this->next, pSVar2->activation = pSVar3, pSVar3 == (SignalActivation *)0x0)) &&
       (pSVar2->dirty == true)) {
      local_20 = (pSVar2->slots)._begin.item;
      pIVar4 = (pSVar2->slots)._end.item;
      do {
        while( true ) {
          if (local_20 == pIVar4) {
            this->data->dirty = false;
            return;
          }
          SVar1 = (local_20->value).state;
          if (SVar1 != connecting) break;
          (local_20->value).state = connected;
LAB_001044ba:
          local_20 = local_20->next;
        }
        if (SVar1 != disconnected) goto LAB_001044ba;
        iVar5 = List<Callback::Emitter::Slot>::remove(&this->data->slots,(char *)&local_20);
        local_20 = (Item *)CONCAT44(extraout_var,iVar5);
      } while( true );
    }
  }
  else if (this->next != (SignalActivation *)0x0) {
    this->next->invalidated = true;
  }
  return;
}

Assistant:

Callback::Emitter::SignalActivation::~SignalActivation()
{
  if(!invalidated)
  {
    if(data && !(data->activation = next) && data->dirty)
    {
      for(List<Slot>::Iterator i = data->slots.begin(), end = data->slots.end(); i != end;)
        switch(i->state)
        {
        case Slot::disconnected:
          i = data->slots.remove(i);
          break;
        case Slot::connecting:
          i->state = Slot::connected;
        default:
          ++i;
        }
      data->dirty = false;
    }
  }
  else if(next)
    next->invalidated = true;
}